

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest11::getTestCaseString_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest11 *this,_test_case *test_case)

{
  _test_case _Var1;
  allocator<char> local_22;
  undefined1 local_21;
  _test_case *local_20;
  _test_case *test_case_local;
  NegativeTest11 *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (NegativeTest11 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  _Var1 = *local_20;
  if (_Var1 == TEST_CASE_FIRST) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT");
  }
  else if (_Var1 == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT");
  }
  else if (_Var1 == TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest11::getTestCaseString(const _test_case& test_case)
{
	std::string result = "?";

	switch (test_case)
	{
	case TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT:
		result = "TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT";
		break;
	case TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT:
		result = "TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT";
		break;
	case TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT:
		result = "TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT";
		break;
	default:
		break;
	}

	return result;
}